

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dma_read.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  nettlp *__buf;
  size_t count;
  uint16_t devn;
  uint16_t busn;
  uintptr_t addr;
  nettlp nt;
  char buf [4096];
  ushort local_106c;
  short local_106a;
  uintptr_t local_1068;
  int local_105c;
  nettlp local_1058;
  undefined1 local_1038 [4104];
  
  local_1058.remote_addr.s_addr = 0;
  local_1058.local_addr.s_addr = 0;
  local_1058.requester = 0;
  local_1058.tag = '\0';
  local_1058._11_1_ = 0;
  local_1058.dir = DMA_ISSUED_BY_LIBTLP;
  local_1058.sockfd = 0;
  local_1058.port = 0;
  local_1058._22_2_ = 0;
  local_1068 = 0;
  local_106a = 0;
  local_106c = 0;
  local_105c = 4;
LAB_00102439:
  while (iVar1 = getopt(argc,argv,"r:l:b:t:a:s:"), iVar1 < 0x6c) {
    if (iVar1 == 0x61) {
      __isoc99_sscanf(_optarg,"0x%lx",&local_1068);
    }
    else {
      if (iVar1 != 0x62) {
        if (iVar1 == -1) {
          iVar1 = nettlp_init(&local_1058);
          if (iVar1 < 0) {
            perror("nettlp_init");
            return iVar1;
          }
          dump_nettlp(&local_1058);
          memset(local_1038,0,0x1000);
          iVar1 = local_105c;
          count = (size_t)local_105c;
          uVar4 = dma_read(&local_1058,local_1068,local_1038,count);
          uVar2 = tlp_calculate_length(local_1068,count);
          printf("tlp_length is %u\n",(ulong)uVar2);
          puts("\n");
          printf("dma_read returns %d\n",uVar4 & 0xffffffff);
          putchar(10);
          uVar2 = tlp_calculate_lstdw(local_1068,count);
          uVar3 = tlp_calculate_fstdw(local_1068,count);
          printf("Last 0x%x, 1st 0x%x\n",(ulong)uVar2,(ulong)uVar3);
          printf("dma_read returns %d\n",uVar4 & 0xffffffff);
          if ((int)uVar4 < 0) {
            perror("dma_read");
          }
          if (0 < (int)uVar4) {
            hexdump(local_1038,iVar1);
            return 0;
          }
          return 0;
        }
switchD_0010245e_caseD_6d:
        puts(
            "usage\n    -r remote addr\n    -l local addr\n    -b bus number, XX:XX\n    -t tag\n    -a target address\n    -s transfer size (default 4-byte)"
            );
        return -1;
      }
      __isoc99_sscanf(_optarg,"%hx:%hx",&local_106a,&local_106c);
      local_1058.requester = local_106a << 8 | local_106c;
    }
  }
  switch(iVar1) {
  case 0x6c:
    __buf = (nettlp *)&local_1058.local_addr;
    break;
  default:
    goto switchD_0010245e_caseD_6d;
  case 0x72:
    __buf = &local_1058;
    break;
  case 0x73:
    goto switchD_0010245e_caseD_73;
  case 0x74:
    iVar1 = atoi(_optarg);
    local_1058.tag = (uint8_t)iVar1;
    goto LAB_00102439;
  }
  iVar1 = inet_pton(2,_optarg,__buf);
  if (iVar1 < 1) {
    perror("inet_pton");
    return -1;
  }
  goto LAB_00102439;
switchD_0010245e_caseD_73:
  local_105c = atoi(_optarg);
  if (local_105c - 0x1001U < 0xfffff000) {
    main_cold_1();
    return -1;
  }
  goto LAB_00102439;
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch, size;
	struct nettlp nt;
	uintptr_t addr;
	uint16_t busn, devn;
	char buf[4096];

	memset(&nt, 0, sizeof(nt));
	size = 4;
	addr = 0;
	busn = 0;
	devn = 0;

	while ((ch = getopt(argc, argv, "r:l:b:t:a:s:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 't':
			nt.tag = atoi(optarg);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 's':
			size = atoi(optarg);
			if (size < 1 || size > 4096) {
				fprintf(stderr, "size must be 0 > | < 4096\n");
				return -1;
			}
			break;

		default :
			usage();
			return -1;
		}
	}

	ret = nettlp_init(&nt);
	if (ret < 0) {
		perror("nettlp_init");
		return ret;
	}
	dump_nettlp(&nt);

	memset(buf, 0, sizeof(buf));


	ret = dma_read(&nt, addr, buf, size);

	printf("tlp_length is %u\n", tlp_calculate_length(addr, size));


	printf("\n\n");
	printf("dma_read returns %d\n", ret);
	printf("\n");
	printf("Last 0x%x, 1st 0x%x\n",
	       tlp_calculate_lstdw(addr, size),
	       tlp_calculate_fstdw(addr, size));

	printf("dma_read returns %d\n", ret);
	if (ret < 0)
		perror("dma_read");


	if (ret > 0)
		hexdump(buf, size);


	return 0;
}